

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O0

void verify_horizontal_right(Board *board,int row,int col,Ship *ship)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  Ship *ship_local;
  int col_local;
  int row_local;
  Board *board_local;
  
  if (col + ship->length + -1 <= board->column + -1) {
    pvVar2 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&board->matrix,(long)row);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar2,(long)(col + ship->length + -1));
    bVar1 = std::operator==(pvVar3,"~");
    if (bVar1) {
      if (col + ship->length <= board->column + -1) {
        pvVar2 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&board->matrix,(long)row);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar2,(long)(col + ship->length));
        bVar1 = std::operator==(pvVar3,"~");
        if (bVar1) {
          Ship::set_values(ship,row,col,'H',1);
          return;
        }
      }
      if (board->column + -1 < col + ship->length) {
        Ship::set_values(ship,row,col,'H',1);
        return;
      }
      Ship::set_values(ship,row,col,'N',0);
      return;
    }
  }
  Ship::set_values(ship,row,col,'N',0);
  return;
}

Assistant:

void verify_horizontal_right( Board *board, int row, int col, Ship *ship )
{
	/*! Checks if the current position plus the rest of the ship exceeds
	 *  the superior border or touches another ship
	 */
    if( ( col + ship->length - 1 <= board->column - 1 ) and ( board->matrix[row][col + ship->length - 1] == "~" ) )
	{
        if( ( col + ship->length <= board->column - 1 ) and ( board->matrix[row][col + ship->length] == "~" ) ) 
        {
            ship->set_values( row, col, 'H', 1 );
        }
        else if( col + ship->length > board->column - 1 )
        {
            ship->set_values( row, col, 'H', 1 );
        }
        else
        {
            ship->set_values( row, col, 'N' , 0 );
        }
    }
    else
    {
        ship->set_values( row, col, 'N' , 0 );
    }
}